

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_math.h
# Opt level: O2

bool glm::rayPlaneIntersection<glm::tvec3<float,(glm::precision)0>>
               (tvec3<float,_(glm::precision)0> *vOut,value_type_conflict *tOut,
               tvec3<float,_(glm::precision)0> *rayFrom,tvec3<float,_(glm::precision)0> *rayDir,
               tvec3<float,_(glm::precision)0> *p,tvec3<float,_(glm::precision)0> *n)

{
  float fVar1;
  float fVar2;
  tvec3<float,_(glm::precision)0> tVar3;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_40;
  
  fVar1 = detail::compute_dot<glm::tvec3,_float,_(glm::precision)0,_false>::call(rayDir,n);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    tVar3 = operator-(p,rayFrom);
    local_40.field_0.z = (float)tVar3.field_0._8_4_;
    local_40._0_8_ = tVar3.field_0._0_8_;
    fVar2 = detail::compute_dot<glm::tvec3,_float,_(glm::precision)0,_false>::call
                      ((tvec3<float,_(glm::precision)0> *)&local_40.field_0,n);
    *tOut = fVar2 / fVar1;
    tVar3 = operator*(rayDir,fVar2 / fVar1);
    local_50.field_0.z = (float)tVar3.field_0._8_4_;
    local_50._0_8_ = tVar3.field_0._0_8_;
    tVar3 = operator+(rayFrom,(tvec3<float,_(glm::precision)0> *)&local_50.field_0);
    *(long *)&vOut->field_0 = tVar3.field_0._0_8_;
    (vOut->field_0).field_0.z = tVar3.field_0._8_4_;
  }
  return (bool)(-(fVar1 != 0.0) & 1);
}

Assistant:

bool rayPlaneIntersection(vector_t& vOut,
                          typename vector_t::value_type& tOut,
						  const vector_t& rayFrom,
						  const vector_t& rayDir,
						  const vector_t& p,
						  const vector_t& n)
{
//	solve: t = (p-rayFrom)*n / rayDir*n
	const typename vector_t::value_type denom = dot(rayDir, n);
	if (denom == 0)
		return false;

//	calculate intersection parameter
	const vector_t v = p - rayFrom;
	tOut = dot(v, n) / denom;
	
//	calculate intersection point
	vOut = rayFrom + rayDir * tOut;
	return true;
}